

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O3

int nsvg__parseStrokeDashArray(NSVGparser *p,char *str,float *strokeDashArray)

{
  char *pcVar1;
  float fVar2;
  void *pvVar3;
  long lVar4;
  NSVGcoordinate c;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  char cVar8;
  float fVar9;
  char item [64];
  char local_78 [72];
  
  if ((*str == '\0') || (*str == 'n')) {
    return 0;
  }
  uVar7 = 0;
LAB_00115fcc:
  local_78[0] = '\0';
  cVar8 = *str;
  while (cVar8 != '\0') {
    pvVar3 = memchr(" \t\n\v\f\r",(int)cVar8,7);
    if ((cVar8 != ',') && (pvVar3 == (void *)0x0)) {
      iVar6 = 0;
      goto LAB_00116006;
    }
    pcVar1 = str + 1;
    str = str + 1;
    cVar8 = *pcVar1;
  }
  lVar4 = 0;
  goto LAB_00116047;
  while( true ) {
    if (iVar6 < 0x3f) {
      lVar4 = (long)iVar6;
      iVar6 = iVar6 + 1;
      local_78[lVar4] = cVar8;
    }
    cVar8 = str[1];
    str = str + 1;
    if (cVar8 == '\0') break;
LAB_00116006:
    pvVar3 = memchr(" \t\n\v\f\r",(int)cVar8,7);
    if ((cVar8 == ',') || (pvVar3 != (void *)0x0)) break;
  }
  lVar4 = (long)iVar6;
LAB_00116047:
  local_78[lVar4] = '\0';
  if (local_78[0] == '\0') goto LAB_001160c8;
  if ((int)uVar7 < 8) {
    fVar9 = p->viewWidth;
    fVar2 = p->viewHeight;
    c = nsvg__parseCoordinateRaw(local_78);
    fVar9 = nsvg__convertToPixels(p,c,0.0,SQRT(fVar9 * fVar9 + fVar2 * fVar2) / 1.4142135);
    lVar4 = (long)(int)uVar7;
    uVar7 = uVar7 + 1;
    strokeDashArray[lVar4] = ABS(fVar9);
  }
  if (*str == '\0') {
LAB_001160c8:
    if ((int)uVar7 < 1) {
      return 0;
    }
    fVar9 = 0.0;
    uVar5 = 0;
    do {
      fVar9 = fVar9 + strokeDashArray[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
    if (fVar9 <= 1e-06) {
      return 0;
    }
    return uVar7;
  }
  goto LAB_00115fcc;
}

Assistant:

static int nsvg__parseStrokeDashArray(NSVGparser* p, const char* str, float* strokeDashArray)
{
	char item[64];
	int count = 0, i;
	float sum = 0.0f;

	// Handle "none"
	if (str[0] == 'n')
		return 0;

	// Parse dashes
	while (*str) {
		str = nsvg__getNextDashItem(str, item);
		if (!*item) break;
		if (count < NSVG_MAX_DASHES)
			strokeDashArray[count++] = fabsf(nsvg__parseCoordinate(p, item, 0.0f, nsvg__actualLength(p)));
	}

	for (i = 0; i < count; i++)
		sum += strokeDashArray[i];
	if (sum <= 1e-6f)
		count = 0;

	return count;
}